

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O3

void __thiscall
ClCommandLine_DoubleDashStringOption_Test::~ClCommandLine_DoubleDashStringOption_Test
          (ClCommandLine_DoubleDashStringOption_Test *this)

{
  anon_unknown.dwarf_26bb7::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, DoubleDashStringOption) {
    opt<std::string> option ("arg");
    this->add ("progname", "--arg", "value");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);
    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "value");
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}